

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.h
# Opt level: O3

void __thiscall SRCINFO::SRCINFO(SRCINFO *this,SRCINFO *other)

{
  SourceContextInfo *pSVar1;
  Type TVar2;
  Type TVar3;
  Type TVar4;
  
  pSVar1 = (other->sourceContextInfo).ptr;
  Memory::Recycler::WBSetBit((char *)this);
  (this->sourceContextInfo).ptr = pSVar1;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(this);
  TVar2 = other->ulColumnHost;
  TVar3 = other->lnMinHost;
  TVar4 = other->ichMinHost;
  this->dlnHost = other->dlnHost;
  this->ulColumnHost = TVar2;
  this->lnMinHost = TVar3;
  this->ichMinHost = TVar4;
  TVar2 = other->ulCharOffset;
  TVar3 = other->moduleID;
  TVar4 = other->grfsi;
  this->ichLimHost = other->ichLimHost;
  this->ulCharOffset = TVar2;
  this->moduleID = TVar3;
  this->grfsi = TVar4;
  return;
}

Assistant:

SRCINFO(const SRCINFO& other)
        :sourceContextInfo(other.sourceContextInfo),
        dlnHost(other.dlnHost),
        ulColumnHost(other.ulColumnHost),
        lnMinHost(other.lnMinHost),
        ichMinHost(other.ichMinHost),
        ichLimHost(other.ichLimHost),
        ulCharOffset(other.ulCharOffset),
        moduleID(other.moduleID),
        grfsi(other.grfsi)
    {
    }